

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon.cpp
# Opt level: O0

void __thiscall QSystemTrayIconPrivate::addPlatformMenu(QSystemTrayIconPrivate *this,QMenu *menu)

{
  bool bVar1;
  QPlatformMenu *pQVar2;
  const_iterator o;
  QMenu *pQVar3;
  QMenu *pQVar4;
  QSystemTrayIconPrivate *in_RSI;
  QPlatformMenu *in_RDI;
  long in_FS_OFFSET;
  QPlatformMenu *platformMenu;
  QAction *action;
  QList<QAction_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QAction_*> actions;
  QList<QAction_*> *in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffa8;
  const_iterator local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QMenu::platformMenu((QMenu *)0x492193);
  if (pQVar2 == (QPlatformMenu *)0x0) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions(in_stack_ffffffffffffffa8);
    pQVar4 = (QMenu *)&local_20;
    local_28.i = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QAction_*>::begin(in_stack_ffffffffffffffa0);
    o = QList<QAction_*>::end(in_stack_ffffffffffffffa0);
    while (bVar1 = QList<QAction_*>::const_iterator::operator!=(&local_28,o), bVar1) {
      QList<QAction_*>::const_iterator::operator*(&local_28);
      pQVar3 = QAction::menu<QMenu*>((QAction *)0x49225b);
      if (pQVar3 != (QMenu *)0x0) {
        QAction::menu<QMenu*>((QAction *)0x49226b);
        addPlatformMenu(in_RSI,pQVar4);
      }
      QList<QAction_*>::const_iterator::operator++(&local_28);
    }
    pQVar4 = (QMenu *)(**(code **)(**(long **)(in_RDI + 0xb0) + 0xa8))();
    if (pQVar4 != (QMenu *)0x0) {
      QMenu::setPlatformMenu(pQVar4,in_RDI);
    }
    QList<QAction_*>::~QList((QList<QAction_*> *)0x4922bf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSystemTrayIconPrivate::addPlatformMenu(QMenu *menu) const
{
#if QT_CONFIG(menu)
    if (menu->platformMenu())
        return; // The platform menu already exists.

    // The recursion depth is the same as menu depth, so should not
    // be higher than 3 levels.
    const auto actions = menu->actions();
    for (QAction *action : actions) {
        if (action->menu())
            addPlatformMenu(action->menu());
    }

    // This menu should be processed *after* its children, otherwise
    // setMenu() is not called on respective QPlatformMenuItems.
    QPlatformMenu *platformMenu = qpa_sys->createMenu();
    if (platformMenu)
        menu->setPlatformMenu(platformMenu);
#else
    Q_UNUSED(menu);
#endif // QT_CONFIG(menu)
}